

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double b;
  char cVar1;
  uchar uVar2;
  uint uVar3;
  cJSON_bool cVar4;
  cJSON_bool cVar5;
  int iVar6;
  size_t sVar7;
  uchar *puVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  uchar uVar11;
  size_t needed;
  size_t needed_00;
  long lVar12;
  cJSON *item_00;
  cJSON *pcVar13;
  long in_FS_OFFSET;
  double local_60;
  undefined8 local_58;
  uchar number_buffer [26];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = 0;
  cVar4 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    cVar1 = (char)item->type;
    cVar4 = cVar5;
    switch(cVar1) {
    case '\x01':
      puVar8 = ensure(output_buffer,6);
      if (puVar8 != (uchar *)0x0) {
        builtin_memcpy(puVar8,"false",6);
        goto LAB_00103353;
      }
      break;
    case '\x02':
      puVar8 = ensure(output_buffer,5);
      if (puVar8 != (uchar *)0x0) {
        builtin_memcpy(puVar8,"true",5);
        goto LAB_00103353;
      }
      break;
    case '\x03':
    case '\x05':
    case '\x06':
    case '\a':
      break;
    case '\x04':
      puVar8 = ensure(output_buffer,5);
      if (puVar8 != (uchar *)0x0) {
        builtin_memcpy(puVar8,"null",5);
        goto LAB_00103353;
      }
      break;
    case '\b':
      b = item->valuedouble;
      number_buffer[8] = '\0';
      number_buffer[9] = '\0';
      number_buffer[10] = '\0';
      number_buffer[0xb] = '\0';
      number_buffer[0xc] = '\0';
      number_buffer[0xd] = '\0';
      number_buffer[0xe] = '\0';
      number_buffer[0xf] = '\0';
      number_buffer[0x10] = '\0';
      number_buffer[0x11] = '\0';
      local_58 = 0;
      number_buffer[0] = '\0';
      number_buffer[1] = '\0';
      number_buffer[2] = '\0';
      number_buffer[3] = '\0';
      number_buffer[4] = '\0';
      number_buffer[5] = '\0';
      number_buffer[6] = '\0';
      number_buffer[7] = '\0';
      uVar2 = get_decimal_point();
      local_60 = 0.0;
      if (NAN(b - b) || NAN(b)) {
        uVar9 = (ulong)local_58 >> 0x20;
        local_58 = CONCAT44((uint)uVar9 & 0xffffff00,0x6c6c756e);
        uVar3 = 4;
      }
      else {
        if ((b != (double)item->valueint) || (NAN(b) || NAN((double)item->valueint))) {
          uVar3 = sprintf((char *)&local_58,"%1.15g");
          iVar6 = __isoc99_sscanf(&local_58,"%lg",&local_60);
          if ((iVar6 != 1) || (cVar4 = compare_double(local_60,b), cVar4 == 0)) {
            uVar3 = sprintf((char *)&local_58,"%1.17g",SUB84(b,0));
          }
        }
        else {
          uVar3 = sprintf((char *)&local_58,"%d");
        }
        if (0x19 < uVar3) goto LAB_00103342;
      }
      uVar9 = (ulong)uVar3;
      puVar8 = ensure(output_buffer,uVar9 + 1);
      if (puVar8 == (uchar *)0x0) goto LAB_00103342;
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = number_buffer[uVar10 - 8];
        if (uVar11 == uVar2) {
          uVar11 = '.';
        }
        puVar8[uVar10] = uVar11;
      }
      puVar8[uVar9] = '\0';
      output_buffer->offset = output_buffer->offset + uVar9;
LAB_00103353:
      cVar4 = 1;
      break;
    default:
      if (cVar1 == '\x10') {
        if (*(long *)(in_FS_OFFSET + 0x28) == unique0x00012000) {
          cVar4 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar4;
        }
        goto LAB_00103378;
      }
      if (cVar1 == ' ') {
        pcVar13 = item->child;
        puVar8 = ensure(output_buffer,1);
        if (puVar8 != (uchar *)0x0) {
          *puVar8 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          while (item_00 = pcVar13, item_00 != (cJSON *)0x0) {
            cVar5 = print_value(item_00,output_buffer);
            cVar4 = 0;
            if (cVar5 == 0) goto switchD_00102f66_caseD_3;
            update_offset(output_buffer);
            pcVar13 = (cJSON *)0x0;
            if (item_00->next != (cJSON *)0x0) {
              uVar9 = (ulong)(output_buffer->format == 0);
              puVar8 = ensure(output_buffer,uVar9 ^ 3);
              if (puVar8 == (uchar *)0x0) goto switchD_00102f66_caseD_3;
              *puVar8 = ',';
              if (output_buffer->format == 0) {
                puVar8 = puVar8 + 1;
              }
              else {
                puVar8[1] = ' ';
                puVar8 = puVar8 + 2;
              }
              *puVar8 = '\0';
              output_buffer->offset = output_buffer->offset + (2 - uVar9);
              pcVar13 = item_00->next;
            }
          }
          puVar8 = ensure(output_buffer,2);
          if (puVar8 != (uchar *)0x0) {
            puVar8[0] = ']';
            puVar8[1] = '\0';
LAB_0010334f:
            output_buffer->depth = output_buffer->depth - 1;
            goto LAB_00103353;
          }
LAB_00103342:
          cVar4 = 0;
        }
      }
      else if (cVar1 == '@') {
        pcVar13 = item->child;
        uVar9 = (ulong)(output_buffer->format == 0);
        puVar8 = ensure(output_buffer,uVar9 ^ 3);
        if (puVar8 != (uchar *)0x0) {
          needed = 2;
          *puVar8 = '{';
          output_buffer->depth = output_buffer->depth + 1;
          if (output_buffer->format != 0) {
            puVar8[1] = '\n';
          }
          output_buffer->offset = output_buffer->offset + (2 - uVar9);
          cVar4 = 0;
          for (; pcVar13 != (cJSON *)0x0; pcVar13 = pcVar13->next) {
            if (output_buffer->format != 0) {
              puVar8 = ensure(output_buffer,output_buffer->depth);
              if (puVar8 == (uchar *)0x0) goto LAB_00103342;
              for (uVar9 = 0; uVar9 < output_buffer->depth; uVar9 = uVar9 + 1) {
                puVar8[uVar9] = '\t';
              }
              output_buffer->offset = output_buffer->offset + output_buffer->depth;
            }
            cVar5 = print_string_ptr((uchar *)pcVar13->string,output_buffer);
            if (cVar5 == 0) goto switchD_00102f66_caseD_3;
            update_offset(output_buffer);
            needed_00 = 2 - (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,needed_00);
            if (puVar8 == (uchar *)0x0) goto switchD_00102f66_caseD_3;
            *puVar8 = ':';
            if (output_buffer->format != 0) {
              puVar8[1] = '\t';
            }
            output_buffer->offset = output_buffer->offset + needed_00;
            cVar5 = print_value(pcVar13,output_buffer);
            if (cVar5 == 0) goto switchD_00102f66_caseD_3;
            update_offset(output_buffer);
            lVar12 = ((ulong)(pcVar13->next != (cJSON *)0x0) + 1) -
                     (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,lVar12 + 1);
            if (puVar8 == (uchar *)0x0) goto switchD_00102f66_caseD_3;
            if (pcVar13->next != (cJSON *)0x0) {
              *puVar8 = ',';
              puVar8 = puVar8 + 1;
            }
            if (output_buffer->format != 0) {
              *puVar8 = '\n';
              puVar8 = puVar8 + 1;
            }
            *puVar8 = '\0';
            output_buffer->offset = output_buffer->offset + lVar12;
          }
          if (output_buffer->format != 0) {
            needed = output_buffer->depth + 1;
          }
          puVar8 = ensure(output_buffer,needed);
          if (puVar8 != (uchar *)0x0) {
            if (output_buffer->format != 0) {
              for (uVar9 = 0; uVar9 < output_buffer->depth - 1; uVar9 = uVar9 + 1) {
                puVar8[uVar9] = '\t';
              }
              puVar8 = puVar8 + uVar9;
            }
            puVar8[0] = '}';
            puVar8[1] = '\0';
            goto LAB_0010334f;
          }
          goto LAB_00103342;
        }
      }
      else {
        cVar4 = 0;
        if ((cVar1 == -0x80) && (cVar4 = cVar5, item->valuestring != (char *)0x0)) {
          sVar7 = strlen(item->valuestring);
          puVar8 = ensure(output_buffer,sVar7 + 1);
          if (puVar8 != (uchar *)0x0) {
            memcpy(puVar8,item->valuestring,sVar7 + 1);
            goto LAB_00103353;
          }
        }
      }
    }
  }
switchD_00102f66_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xffffffffffffffc8) {
    return cVar4;
  }
LAB_00103378:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}